

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

ActionMessage * __thiscall
helics::ActionMessage::operator=
          (ActionMessage *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  _Alloc_hider _Var1;
  Message *pMVar2;
  _Alloc_hider _Var3;
  long lVar4;
  size_type *psVar5;
  size_type *local_98;
  size_type local_90;
  size_type local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  size_type *local_78;
  size_type local_70;
  size_type local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  size_type *local_38;
  size_type local_30;
  size_type local_28;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  this->messageAction = cmd_send_message;
  pMVar2 = (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  this->messageID = pMVar2->messageID;
  this->flags = pMVar2->flags;
  SmallBuffer::operator=(&this->payload,&pMVar2->data);
  pMVar2 = (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  (this->actionTime).internalTimeCode = (pMVar2->time).internalTimeCode;
  local_98 = &local_88;
  _Var3._M_p = (pMVar2->dest)._M_dataplus._M_p;
  _Var1._M_p = (pointer)&(pMVar2->dest).field_2;
  if (_Var3._M_p == _Var1._M_p) {
    local_88 = *(size_type *)_Var1._M_p;
    uStack_80 = *(undefined4 *)((long)&(pMVar2->dest).field_2 + 8);
    uStack_7c = *(undefined4 *)((long)&(pMVar2->dest).field_2 + 0xc);
  }
  else {
    local_88 = *(size_type *)_Var1._M_p;
    local_98 = (size_type *)_Var3._M_p;
  }
  local_90 = (pMVar2->dest)._M_string_length;
  local_78 = &local_68;
  (pMVar2->dest)._M_dataplus._M_p = _Var1._M_p;
  (pMVar2->dest)._M_string_length = 0;
  (pMVar2->dest).field_2._M_local_buf[0] = '\0';
  pMVar2 = (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  _Var3._M_p = (pMVar2->source)._M_dataplus._M_p;
  _Var1._M_p = (pointer)&(pMVar2->source).field_2;
  if (_Var3._M_p == _Var1._M_p) {
    local_68 = *(size_type *)_Var1._M_p;
    uStack_60 = *(undefined4 *)((long)&(pMVar2->source).field_2 + 8);
    uStack_5c = *(undefined4 *)((long)&(pMVar2->source).field_2 + 0xc);
  }
  else {
    local_68 = *(size_type *)_Var1._M_p;
    local_78 = (size_type *)_Var3._M_p;
  }
  local_70 = (pMVar2->source)._M_string_length;
  local_58 = &local_48;
  (pMVar2->source)._M_dataplus._M_p = _Var1._M_p;
  (pMVar2->source)._M_string_length = 0;
  (pMVar2->source).field_2._M_local_buf[0] = '\0';
  pMVar2 = (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  _Var3._M_p = (pMVar2->original_source)._M_dataplus._M_p;
  _Var1._M_p = (pointer)&(pMVar2->original_source).field_2;
  if (_Var3._M_p == _Var1._M_p) {
    local_48 = *(size_type *)_Var1._M_p;
    uStack_40 = *(undefined4 *)((long)&(pMVar2->original_source).field_2 + 8);
    uStack_3c = *(undefined4 *)((long)&(pMVar2->original_source).field_2 + 0xc);
  }
  else {
    local_48 = *(size_type *)_Var1._M_p;
    local_58 = (size_type *)_Var3._M_p;
  }
  local_50 = (pMVar2->original_source)._M_string_length;
  psVar5 = &local_28;
  (pMVar2->original_source)._M_dataplus._M_p = _Var1._M_p;
  (pMVar2->original_source)._M_string_length = 0;
  (pMVar2->original_source).field_2._M_local_buf[0] = '\0';
  pMVar2 = (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  local_38 = (size_type *)(pMVar2->original_dest)._M_dataplus._M_p;
  _Var1._M_p = (pointer)&(pMVar2->original_dest).field_2;
  if (local_38 == (size_type *)_Var1._M_p) {
    local_28 = *(size_type *)_Var1._M_p;
    uStack_20 = *(undefined4 *)((long)&(pMVar2->original_dest).field_2 + 8);
    uStack_1c = *(undefined4 *)((long)&(pMVar2->original_dest).field_2 + 0xc);
    local_38 = psVar5;
  }
  else {
    local_28 = *(size_type *)_Var1._M_p;
  }
  local_30 = (pMVar2->original_dest)._M_string_length;
  (pMVar2->original_dest)._M_dataplus._M_p = _Var1._M_p;
  (pMVar2->original_dest)._M_string_length = 0;
  (pMVar2->original_dest).field_2._M_local_buf[0] = '\0';
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->stringData,
             &local_98);
  lVar4 = -0x80;
  do {
    if (psVar5 != (size_type *)psVar5[-2]) {
      operator_delete((size_type *)psVar5[-2],*psVar5 + 1);
    }
    psVar5 = psVar5 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  return this;
}

Assistant:

ActionMessage& ActionMessage::operator=(std::unique_ptr<Message> message) noexcept
{
    messageAction = CMD_SEND_MESSAGE;
    messageID = message->messageID;
    flags = message->flags;
    payload = std::move(message->data);
    actionTime = message->time;
    stringData = {std::move(message->dest),
                  std::move(message->source),
                  std::move(message->original_source),
                  std::move(message->original_dest)};
    return *this;
}